

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_base.c
# Opt level: O1

void get_msb_lsb_at_pos(RK_U32 *msb,RK_U32 *lsb,RK_U8 *buf,RK_U32 bytepos)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(bytepos & 0xfffffff8);
  uVar2 = bytepos & 7;
  if (uVar2 != 0) {
    memset(buf + bytepos,0,(ulong)(8 - uVar2));
  }
  uVar1 = *(uint *)(buf + uVar3);
  *msb = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = 0;
  if (4 < uVar2) {
    uVar1 = (uint)buf[uVar3 + 6] << 8 | (uint)buf[uVar3 + 5] << 0x10 | (uint)buf[uVar3 + 4] << 0x18;
  }
  *lsb = uVar1;
  return;
}

Assistant:

void get_msb_lsb_at_pos(RK_U32 *msb, RK_U32 *lsb, RK_U8 *buf, RK_U32 bytepos)
{
    RK_U32 val32;
    RK_S32 left_byte = bytepos & 0x7;
    RK_U8 *tmp = buf + (bytepos & (~0x7));

    // clear the rest bytes in 64bit
    if (left_byte) {
        RK_U32 i;

        for (i = left_byte; i < 8; i++)
            tmp[i] = 0;
    }

    val32 = (tmp[0] << 24) |
            (tmp[1] << 16) |
            (tmp[2] <<  8) |
            (tmp[3] <<  0);

    *msb = val32;

    if (left_byte > 4) {
        val32 = (tmp[4] << 24) |
                (tmp[5] << 16) |
                (tmp[6] <<  8);
    } else
        val32 = 0;

    *lsb = val32;
}